

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall clipp::parser::try_match_blocked(parser *this,arg_string *arg)

{
  bool bVar1;
  parser ahead;
  parser pStack_108;
  
  if ((this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    parser(&pStack_108,this);
    bVar1 = try_match_blocked(this,&pStack_108,arg);
    ~parser(&pStack_108);
    if (bVar1) {
      return true;
    }
  }
  if (this->root_ != (group *)0x0) {
    parser(&pStack_108,this->root_,this->index_ + 1);
    bVar1 = try_match_blocked(this,&pStack_108,arg);
    ~parser(&pStack_108);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool try_match_blocked(const arg_string& arg)
    {
        //try to match ahead (using temporary parser)
        if(pos_) {
            auto ahead = *this;
            if(try_match_blocked(std::move(ahead), arg)) return true;
        }

        //try to match from the beginning (using temporary parser)
        if(root_) {
            parser all{*root_, index_+1};
            if(try_match_blocked(std::move(all), arg)) return true;
        }

        return false;
    }